

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O0

uint utf8_text_length(string *str)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  undefined4 local_28;
  int i;
  bool in_color;
  char *data;
  int charLength;
  int byteLength;
  string *str_local;
  
  uVar2 = std::__cxx11::string::length();
  lVar3 = std::__cxx11::string::data();
  bVar1 = false;
  data._0_4_ = uVar2;
  for (local_28 = 0; local_28 < (int)uVar2; local_28 = local_28 + 1) {
    if (bVar1) {
      if (*(char *)(lVar3 + local_28) == 'm') {
        bVar1 = false;
      }
      data._0_4_ = (uint)data - 1;
    }
    else if (*(char *)(lVar3 + local_28) == '\x1b') {
      bVar1 = true;
      data._0_4_ = (uint)data - 1;
    }
    else if (((int)*(char *)(lVar3 + local_28) & 0xc0U) == 0x80) {
      data._0_4_ = (uint)data - 1;
    }
  }
  return (uint)data;
}

Assistant:

unsigned int utf8_text_length (const std::string& str)
{
  int byteLength = str.length ();
  int charLength = byteLength;
  const char* data = str.data ();
  bool in_color = false;

  // Decrement the number of bytes for each byte that matches 0b10??????
  // this way only the first byte of any utf8 sequence is counted.
  for (int i = 0; i < byteLength; i++)
  {
    if (in_color)
    {
      if (data[i] == 'm')
        in_color = false;

      --charLength;
    }
    else
    {
      if (data[i] == 033)
      {
        in_color = true;
        --charLength;
      }
      else
      {
        // Extract the first two bits and check whether they are 10
        if ((data[i] & 0xC0) == 0x80)
          --charLength;
      }
    }
  }

  return charLength;
}